

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

optional<int> __thiscall ear::Layout::indexForName(Layout *this,string *name)

{
  bool bVar1;
  const_iterator __first;
  difference_type dVar2;
  int local_4c;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  local_48;
  Channel *local_40;
  Channel *local_38;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  local_30;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  local_28;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  it;
  string *name_local;
  Layout *this_local;
  
  it._M_current = (Channel *)name;
  local_30._M_current =
       (Channel *)std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  local_38 = (Channel *)
             std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  local_40 = it._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                       (local_30,(__normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                                  )local_38,it._M_current);
  local_48._M_current =
       (Channel *)std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar1) {
    __first = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
    dVar2 = std::
            distance<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>>
                      ((__normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                        )__first._M_current,local_28);
    local_4c = (int)dVar2;
    boost::optional<int>::optional((optional<int> *)&this_local,&local_4c);
  }
  else {
    boost::optional<int>::optional((optional<int> *)&this_local);
  }
  return (optional<int>)(type)this_local;
}

Assistant:

boost::optional<int> Layout::indexForName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    if (it != _channels.end()) {
      return static_cast<int>(std::distance(_channels.begin(), it));
    } else {
      return boost::none;
    }
  }